

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildArgOut
          (IRBuilderAsmJs *this,Opnd *srcOpnd,uint32 dstRegSlot,uint32 offset,IRType type,
          ValueType valueType)

{
  SymTable *this_00;
  code *pcVar1;
  bool bVar2;
  uint16 argSlotNum;
  uint uVar3;
  undefined4 *puVar4;
  StackSym *sym;
  Instr *local_68;
  Instr *instr;
  SymOpnd *local_58;
  Opnd *dstOpnd;
  Instr *pIStack_48;
  uint slotIndex;
  Instr *instr_1;
  Opnd *tmpDst;
  StackSym *symDst;
  uint32 local_28;
  ArgSlot dstArgSlot;
  IRType type_local;
  uint32 offset_local;
  uint32 dstRegSlot_local;
  Opnd *srcOpnd_local;
  IRBuilderAsmJs *this_local;
  ValueType valueType_local;
  
  symDst._4_2_ = (uint16)dstRegSlot;
  symDst._7_1_ = type;
  local_28 = offset;
  _dstArgSlot = dstRegSlot;
  _offset_local = (Instr *)srcOpnd;
  srcOpnd_local = (Opnd *)this;
  this_local._6_2_ = valueType.field_0;
  if ((dstRegSlot & 0xffff) == dstRegSlot) {
    tmpDst = (Opnd *)0x0;
    if (type == TyVar) {
      this_00 = this->m_func->m_symTable;
      argSlotNum = UInt16Math::Add(symDst._4_2_,1);
      tmpDst = (Opnd *)SymTable::GetArgSlotSym(this_00,argSlotNum);
      sym = StackSym::New(this->m_func);
      instr_1 = (Instr *)IR::RegOpnd::New(sym,TyVar,this->m_func);
      pIStack_48 = IR::Instr::New(ToVar,(Opnd *)instr_1,(Opnd *)_offset_local,this->m_func);
      AddInstr(this,pIStack_48,local_28);
      _offset_local = instr_1;
    }
    else {
      uVar3 = RealCount::Count(&(this->m_argStack->
                                super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                                super_RealCount);
      if ((dstRegSlot & 0xffff) < uVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7eb,"(dstArgSlot >= m_argStack->Count())",
                           "dstArgSlot >= m_argStack->Count()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      dstOpnd._4_4_ =
           RealCount::Count(&(this->m_argStack->
                             super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                             super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                             super_RealCount);
      if (0xfffe < dstOpnd._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7ed,"(slotIndex < (65535))","slotIndex < (65535)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      tmpDst = (Opnd *)StackSym::NewArgSlotSym((ArgSlot)dstOpnd._4_4_,this->m_func,symDst._7_1_);
      *(uint *)&((StackSym *)tmpDst)->field_0x18 =
           *(uint *)&((StackSym *)tmpDst)->field_0x18 & 0xffffefff | 0x1000;
    }
    local_58 = IR::SymOpnd::New((Sym *)tmpDst,symDst._7_1_,this->m_func);
    bVar2 = ValueType::IsUninitialized((ValueType *)((long)&this_local + 6));
    if (!bVar2) {
      instr._6_2_ = this_local._6_2_;
      IR::Opnd::SetValueType(&local_58->super_Opnd,(ValueType)this_local._6_2_);
    }
    local_68 = IR::Instr::New(ArgOut_A,&local_58->super_Opnd,(Opnd *)_offset_local,this->m_func);
    AddInstr(this,local_68,local_28);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Push
              (&this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
               &local_68);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                     ,0x7db,"((0))","Arg count too big...");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void IRBuilderAsmJs::BuildArgOut(IR::Opnd* srcOpnd, uint32 dstRegSlot, uint32 offset, IRType type, ValueType valueType)
{
    Js::ArgSlot dstArgSlot = (Js::ArgSlot)dstRegSlot;
    if ((uint32)dstArgSlot != dstRegSlot)
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }
    StackSym * symDst = nullptr;
    if (type == TyVar)
    {
        symDst = m_func->m_symTable->GetArgSlotSym(ArgSlotMath::Add(dstArgSlot, 1));
        IR::Opnd * tmpDst = IR::RegOpnd::New(StackSym::New(m_func), TyVar, m_func);

        IR::Instr * instr = IR::Instr::New(Js::OpCode::ToVar, tmpDst, srcOpnd, m_func);
        AddInstr(instr, offset);
        srcOpnd = tmpDst;
    }
    else
    {
        // Some arg types may use multiple slots, so can't rely on count from bytecode
        Assert(dstArgSlot >= m_argStack->Count());
        uint slotIndex = m_argStack->Count();
        AssertOrFailFast(slotIndex < UINT16_MAX);

        symDst = StackSym::NewArgSlotSym((Js::ArgSlot)slotIndex, m_func, type);
        symDst->m_allocated = true;
    }

    IR::Opnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    if (!valueType.IsUninitialized())
    {
        dstOpnd->SetValueType(valueType);
    }

    IR::Instr * instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);

    m_argStack->Push(instr);
}